

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<signed_char,int>
          (BaseAppender *this,Vector *col,char input)

{
  int iVar1;
  
  iVar1 = Cast::Operation<signed_char,int>(input);
  *(int *)(col->data + (this->chunk).count * 4) = iVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}